

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool thumb_insn_is_16bit(DisasContext_conflict1 *s,uint32_t pc,uint32_t insn)

{
  uc_struct_conflict2 *puVar1;
  int iVar2;
  uc_struct_conflict2 *uc;
  uint32_t insn_local;
  uint32_t pc_local;
  DisasContext_conflict1 *s_local;
  
  puVar1 = s->uc;
  if (insn >> 0xb < 0x1d) {
    s_local._7_1_ = true;
  }
  else {
    iVar2 = arm_dc_feature(s,6);
    if ((iVar2 == 0) && (iVar2 = arm_dc_feature(s,9), iVar2 == 0)) {
      if ((insn >> 0xb == 0x1e) &&
         ((ulong)pc - s->page_start < (ulong)(long)(-3 - (int)puVar1->init_target_page->mask))) {
        return false;
      }
      return true;
    }
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool thumb_insn_is_16bit(DisasContext *s, uint32_t pc, uint32_t insn)
{
    struct uc_struct *uc = s->uc;
    /*
     * Return true if this is a 16 bit instruction. We must be precise
     * about this (matching the decode).
     */
    if ((insn >> 11) < 0x1d) {
        /* Definitely a 16-bit instruction */
        return true;
    }

    /* Top five bits 0b11101 / 0b11110 / 0b11111 : this is the
     * first half of a 32-bit Thumb insn. Thumb-1 cores might
     * end up actually treating this as two 16-bit insns, though,
     * if it's half of a bl/blx pair that might span a page boundary.
     */
    if (arm_dc_feature(s, ARM_FEATURE_THUMB2) ||
        arm_dc_feature(s, ARM_FEATURE_M)) {
        /* Thumb2 cores (including all M profile ones) always treat
         * 32-bit insns as 32-bit.
         */
        return false;
    }

    if ((insn >> 11) == 0x1e && pc - s->page_start < TARGET_PAGE_SIZE - 3) {
        /* 0b1111_0xxx_xxxx_xxxx : BL/BLX prefix, and the suffix
         * is not on the next page; we merge this into a 32-bit
         * insn.
         */
        return false;
    }
    /* 0b1110_1xxx_xxxx_xxxx : BLX suffix (or UNDEF);
     * 0b1111_1xxx_xxxx_xxxx : BL suffix;
     * 0b1111_0xxx_xxxx_xxxx : BL/BLX prefix on the end of a page
     *  -- handle as single 16 bit insn
     */
    return true;
}